

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall cnn::ComputationGraph::add_input(ComputationGraph *this,real s)

{
  size_type sVar1;
  ScalarInputNode *in_RSI;
  VariableIndex *in_RDI;
  VariableIndex *new_node_index;
  VariableIndex *in_stack_00000058;
  ComputationGraph *in_stack_00000060;
  uint uVar2;
  VariableIndex *__x;
  uint local_18 [6];
  
  __x = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RSI);
  local_18[0] = (uint)sVar1;
  VariableIndex::VariableIndex(in_RDI,local_18);
  operator_new(0x60);
  ScalarInputNode::ScalarInputNode(in_RSI,(real)((ulong)__x >> 0x20));
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RSI,(value_type *)__x);
  uVar2 = (uint)__x;
  set_dim_for_new_node(in_stack_00000060,in_stack_00000058);
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_input(real s) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new ScalarInputNode(s));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}